

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O3

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,13>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  VectorXd local_48;
  MatrixXd local_38;
  
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  local_78.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_78,2,0x25);
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_58,0x25);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,0)
  ;
  *pSVar1 = 0.4961358947410461;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,0)
  ;
  *pSVar1 = 0.007728210517907882;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,1)
  ;
  *pSVar1 = 0.496135894741046;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,1)
  ;
  *pSVar1 = 0.49613589474104614;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,2)
  ;
  *pSVar1 = 0.007728210517907841;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,2)
  ;
  *pSVar1 = 0.49613589474104625;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,3)
  ;
  *pSVar1 = 0.4696086896534919;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,3)
  ;
  *pSVar1 = 0.06078262069301624;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,4)
  ;
  *pSVar1 = 0.46960868965349184;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,4)
  ;
  *pSVar1 = 0.469608689653492;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,5)
  ;
  *pSVar1 = 0.060782620693016154;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,5)
  ;
  *pSVar1 = 0.4696086896534921;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,6)
  ;
  *pSVar1 = 0.2311102849490822;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,6)
  ;
  *pSVar1 = 0.23111028494908237;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,7)
  ;
  *pSVar1 = 0.5377794301018355;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,7)
  ;
  *pSVar1 = 0.23111028494908226;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,8)
  ;
  *pSVar1 = 0.2311102849490823;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,8)
  ;
  *pSVar1 = 0.5377794301018356;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,9)
  ;
  *pSVar1 = 0.2920786885766364;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,9)
  ;
  *pSVar1 = 0.018988004383759048;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,10
                     );
  *pSVar1 = 0.6889333070396045;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,10
                     );
  *pSVar1 = 0.29207868857663644;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0xb);
  *pSVar1 = 0.018988004383759083;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0xb);
  *pSVar1 = 0.6889333070396048;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0xc);
  *pSVar1 = 0.6889333070396045;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0xc);
  *pSVar1 = 0.018988004383759048;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0xd);
  *pSVar1 = 0.29207868857663644;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0xd);
  *pSVar1 = 0.6889333070396046;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0xe);
  *pSVar1 = 0.01898800438375889;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0xe);
  *pSVar1 = 0.2920786885766367;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0xf);
  *pSVar1 = 0.33333333333333326;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0xf);
  *pSVar1 = 0.3333333333333334;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x10);
  *pSVar1 = 0.26674525331035115;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x10);
  *pSVar1 = 0.09773603106601655;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x11);
  *pSVar1 = 0.6355187156236324;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x11);
  *pSVar1 = 0.2667452533103512;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x12);
  *pSVar1 = 0.09773603106601647;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x12);
  *pSVar1 = 0.6355187156236326;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x13);
  *pSVar1 = 0.6355187156236323;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x13);
  *pSVar1 = 0.09773603106601655;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x14);
  *pSVar1 = 0.2667452533103513;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x14);
  *pSVar1 = 0.6355187156236323;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x15);
  *pSVar1 = 0.09773603106601639;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x15);
  *pSVar1 = 0.2667452533103514;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x16);
  *pSVar1 = 0.4144775702790545;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x16);
  *pSVar1 = 0.1710448594418909;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x17);
  *pSVar1 = 0.4144775702790545;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x17);
  *pSVar1 = 0.41447757027905463;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x18);
  *pSVar1 = 0.17104485944189082;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x18);
  *pSVar1 = 0.4144775702790547;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x19);
  *pSVar1 = 0.11355991257213308;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x19);
  *pSVar1 = 0.11355991257213333;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1a);
  *pSVar1 = 0.7728801748557336;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1a);
  *pSVar1 = 0.11355991257213308;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1b);
  *pSVar1 = 0.11355991257213338;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1b);
  *pSVar1 = 0.7728801748557337;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1c);
  *pSVar1 = 0.1267997757838373;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1c);
  *pSVar1 = 0.02196634420652925;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1d);
  *pSVar1 = 0.8512338800096334;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1d);
  *pSVar1 = 0.12679977578383728;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1e);
  *pSVar1 = 0.02196634420652943;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1e);
  *pSVar1 = 0.8512338800096335;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x1f);
  *pSVar1 = 0.8512338800096334;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x1f);
  *pSVar1 = 0.02196634420652925;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x20);
  *pSVar1 = 0.1267997757838374;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x20);
  *pSVar1 = 0.8512338800096335;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x21);
  *pSVar1 = 0.021966344206529015;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x21);
  *pSVar1 = 0.12679977578383766;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x22);
  *pSVar1 = 0.024895931491216244;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x22);
  *pSVar1 = 0.02489593149121655;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x23);
  *pSVar1 = 0.9502081370175671;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x23);
  *pSVar1 = 0.02489593149121623;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,
                      0x24);
  *pSVar1 = 0.02489593149121666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,
                      0x24);
  *pSVar1 = 0.9502081370175673;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0);
  *pSVar2 = 0.004970738180536293;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,1);
  *pSVar2 = 0.004970738180536293;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,2);
  *pSVar2 = 0.004970738180536293;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,3);
  *pSVar2 = 0.01639062080186148;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,4);
  *pSVar2 = 0.01639062080186148;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,5);
  *pSVar2 = 0.01639062080186148;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,6);
  *pSVar2 = 0.023031204796389117;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,7);
  *pSVar2 = 0.023031204796389117;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,8);
  *pSVar2 = 0.023031204796389117;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,9);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,10);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0xb);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0xc);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0xd);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0xe);
  *pSVar2 = 0.009062749323100439;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0xf);
  *pSVar2 = 0.025811323332145402;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x10);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x11);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x12);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x13);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x14);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x15);
  *pSVar2 = 0.01860598022863076;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x16);
  *pSVar2 = 0.023473547771077588;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x17);
  *pSVar2 = 0.023473547771077588;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x18);
  *pSVar2 = 0.023473547771077588;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x19);
  *pSVar2 = 0.015451548987879893;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1a);
  *pSVar2 = 0.015451548987879893;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1b);
  *pSVar2 = 0.015451548987879893;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1c);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1d);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1e);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x1f);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x20);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x21);
  *pSVar2 = 0.007696536341891086;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x22);
  *pSVar2 = 0.00401469989762921;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x23);
  *pSVar2 = 0.00401469989762921;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0x24);
  *pSVar2 = 0.00401469989762921;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_78.m_storage.m_data;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_78.m_storage.m_rows;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_78.m_storage.m_cols;
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  local_78.m_storage.m_cols = 0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_58.m_storage.m_data;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_58.m_storage.m_rows;
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_38,&local_48,0xd);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_58.m_storage.m_data);
  free(local_78.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 13>() { // NOLINT
  Eigen::MatrixXd points(2, 37);
  Eigen::VectorXd weights(37);

  points(0, 0) = 0.49613589474104607957;
  points(1, 0) = 0.0077282105179078816257;
  points(0, 1) = 0.49613589474104602406;
  points(1, 1) = 0.49613589474104613508;
  points(0, 2) = 0.0077282105179078408597;
  points(1, 2) = 0.4961358947410462461;
  points(0, 3) = 0.4696086896534918953;
  points(1, 3) = 0.060782620693016237157;
  points(0, 4) = 0.46960868965349183979;
  points(1, 4) = 0.46960868965349200632;
  points(0, 5) = 0.06078262069301615389;
  points(1, 5) = 0.46960868965349211734;
  points(0, 6) = 0.23111028494908220088;
  points(1, 6) = 0.23111028494908236741;
  points(0, 7) = 0.53777943010183548722;
  points(1, 7) = 0.23111028494908225639;
  points(0, 8) = 0.2311102849490823119;
  points(1, 8) = 0.53777943010183559824;
  points(0, 9) = 0.29207868857663638051;
  points(1, 9) = 0.018988004383759048144;
  points(0, 10) = 0.68893330703960453665;
  points(1, 10) = 0.29207868857663643603;
  points(0, 11) = 0.018988004383759082838;
  points(1, 11) = 0.68893330703960475869;
  points(0, 12) = 0.68893330703960453665;
  points(1, 12) = 0.018988004383759048144;
  points(0, 13) = 0.29207868857663643603;
  points(1, 13) = 0.68893330703960464767;
  points(0, 14) = 0.018988004383758888549;
  points(1, 14) = 0.29207868857663671358;
  points(0, 15) = 0.33333333333333325932;
  points(1, 15) = 0.33333333333333342585;
  points(0, 16) = 0.26674525331035114917;
  points(1, 16) = 0.097736031066016554325;
  points(0, 17) = 0.63551871562363237977;
  points(1, 17) = 0.26674525331035120468;
  points(0, 18) = 0.097736031066016471058;
  points(1, 18) = 0.63551871562363260182;
  points(0, 19) = 0.63551871562363226875;
  points(1, 19) = 0.097736031066016554325;
  points(0, 20) = 0.2667452533103513157;
  points(1, 20) = 0.63551871562363226875;
  points(0, 21) = 0.097736031066016387792;
  points(1, 21) = 0.26674525331035142672;
  points(0, 22) = 0.4144775702790545191;
  points(1, 22) = 0.17104485944189090629;
  points(0, 23) = 0.4144775702790545191;
  points(1, 23) = 0.41447757027905463012;
  points(0, 24) = 0.17104485944189082303;
  points(1, 24) = 0.41447757027905468563;
  points(0, 25) = 0.11355991257213307599;
  points(1, 25) = 0.11355991257213332579;
  points(0, 26) = 0.77288017485573357046;
  points(1, 26) = 0.11355991257213307599;
  points(0, 27) = 0.1135599125721333813;
  points(1, 27) = 0.77288017485573368148;
  points(0, 28) = 0.12679977578383730408;
  points(1, 28) = 0.021966344206529250793;
  points(0, 29) = 0.8512338800096334035;
  points(1, 29) = 0.12679977578383727632;
  points(0, 30) = 0.021966344206529431204;
  points(1, 30) = 0.85123388000963351452;
  points(0, 31) = 0.8512338800096334035;
  points(1, 31) = 0.021966344206529250793;
  points(0, 32) = 0.12679977578383738734;
  points(1, 32) = 0.85123388000963351452;
  points(0, 33) = 0.021966344206529014871;
  points(1, 33) = 0.1267997757838376649;
  points(0, 34) = 0.02489593149121624438;
  points(1, 34) = 0.024895931491216549691;
  points(0, 35) = 0.95020813701756712266;
  points(1, 35) = 0.024895931491216230502;
  points(0, 36) = 0.024895931491216660714;
  points(1, 36) = 0.95020813701756734471;

  weights(0) = 0.0049707381805362930993;
  weights(1) = 0.0049707381805362930993;
  weights(2) = 0.0049707381805362930993;
  weights(3) = 0.01639062080186148157;
  weights(4) = 0.01639062080186148157;
  weights(5) = 0.01639062080186148157;
  weights(6) = 0.023031204796389117412;
  weights(7) = 0.023031204796389117412;
  weights(8) = 0.023031204796389117412;
  weights(9) = 0.0090627493231004389168;
  weights(10) = 0.0090627493231004389168;
  weights(11) = 0.0090627493231004389168;
  weights(12) = 0.0090627493231004389168;
  weights(13) = 0.0090627493231004389168;
  weights(14) = 0.0090627493231004389168;
  weights(15) = 0.02581132333214540206;
  weights(16) = 0.018605980228630761286;
  weights(17) = 0.018605980228630761286;
  weights(18) = 0.018605980228630761286;
  weights(19) = 0.018605980228630761286;
  weights(20) = 0.018605980228630761286;
  weights(21) = 0.018605980228630761286;
  weights(22) = 0.023473547771077588053;
  weights(23) = 0.023473547771077588053;
  weights(24) = 0.023473547771077588053;
  weights(25) = 0.015451548987879893185;
  weights(26) = 0.015451548987879893185;
  weights(27) = 0.015451548987879893185;
  weights(28) = 0.007696536341891086104;
  weights(29) = 0.007696536341891086104;
  weights(30) = 0.007696536341891086104;
  weights(31) = 0.007696536341891086104;
  weights(32) = 0.007696536341891086104;
  weights(33) = 0.007696536341891086104;
  weights(34) = 0.0040146998976292097225;
  weights(35) = 0.0040146998976292097225;
  weights(36) = 0.0040146998976292097225;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 13);
}